

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O1

QRectF * __thiscall QRectF::normalized(QRectF *__return_storage_ptr__,QRectF *this)

{
  double dVar1;
  qreal qVar2;
  qreal qVar3;
  qreal qVar4;
  
  qVar2 = this->xp;
  qVar3 = this->yp;
  qVar4 = this->h;
  __return_storage_ptr__->w = this->w;
  __return_storage_ptr__->h = qVar4;
  __return_storage_ptr__->xp = qVar2;
  __return_storage_ptr__->yp = qVar3;
  dVar1 = __return_storage_ptr__->w;
  if (dVar1 < 0.0) {
    __return_storage_ptr__->xp = __return_storage_ptr__->xp + dVar1;
    __return_storage_ptr__->w = -dVar1;
  }
  dVar1 = __return_storage_ptr__->h;
  if (dVar1 < 0.0) {
    __return_storage_ptr__->yp = __return_storage_ptr__->yp + dVar1;
    __return_storage_ptr__->h = -dVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

QRectF QRectF::normalized() const noexcept
{
    QRectF r = *this;
    if (r.w < 0) {
        r.xp += r.w;
        r.w = -r.w;
    }
    if (r.h < 0) {
        r.yp += r.h;
        r.h = -r.h;
    }
    return r;
}